

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

mat4 * __thiscall lumeview::Camera::view_matrix(mat4 *__return_storage_ptr__,Camera *this)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vec3 vVar12;
  float local_78;
  float fStack_74;
  
  vVar12 = forward(this);
  fVar6 = (this->m_trans).field_0.field_0.x -
          (this->m_scale).field_0.field_0.x * vVar12.field_0._0_4_;
  fVar4 = (this->m_trans).field_0.field_0.y -
          vVar12.field_0._4_4_ * (this->m_scale).field_0.field_0.y;
  fVar10 = (this->m_trans).field_0.field_0.z;
  fVar2 = fVar10 - vVar12.field_0._8_4_ * (this->m_scale).field_0.field_0.z;
  uVar1 = *(undefined8 *)&(this->m_trans).field_0;
  vVar12 = up(this);
  local_78 = (float)uVar1;
  fStack_74 = (float)((ulong)uVar1 >> 0x20);
  local_78 = local_78 - fVar6;
  fStack_74 = fStack_74 - fVar4;
  fVar10 = fVar10 - fVar2;
  fVar3 = fVar10 * fVar10 + fStack_74 * fStack_74 + local_78 * local_78;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  local_78 = local_78 * fVar3;
  fStack_74 = fStack_74 * fVar3;
  fVar10 = fVar10 * fVar3;
  fVar9 = fStack_74 * vVar12.field_0._8_4_ - fVar10 * vVar12.field_0._4_4_;
  fVar11 = fVar10 * vVar12.field_0._0_4_ - vVar12.field_0._8_4_ * local_78;
  fVar7 = vVar12.field_0._4_4_ * local_78 - fStack_74 * vVar12.field_0._0_4_;
  fVar3 = fVar7 * fVar7 + fVar11 * fVar11 + fVar9 * fVar9;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  fVar9 = fVar9 * fVar3;
  fVar11 = fVar11 * fVar3;
  fVar3 = fVar3 * fVar7;
  fVar7 = fVar11 * fVar10 - fVar3 * fStack_74;
  fVar5 = fVar3 * local_78 - fVar9 * fVar10;
  fVar8 = fVar9 * fStack_74 - fVar11 * local_78;
  *(undefined8 *)&__return_storage_ptr__->value[1].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[1].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[0].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[0].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[2].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[2].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[3].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[3].field_0 + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[0].field_0 + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[0].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[1].field_0 + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->value[2].field_0 = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[2].field_0 + 0xc) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->value[3].field_0 + 4) = 0;
  __return_storage_ptr__->value[3].field_0.field_0.w = 1.0;
  __return_storage_ptr__->value[0].field_0.field_0.x = fVar9;
  __return_storage_ptr__->value[1].field_0.field_0.x = fVar11;
  __return_storage_ptr__->value[2].field_0.field_0.x = fVar3;
  __return_storage_ptr__->value[0].field_0.field_0.y = fVar7;
  __return_storage_ptr__->value[1].field_0.field_0.y = fVar5;
  __return_storage_ptr__->value[2].field_0.field_0.y = fVar8;
  __return_storage_ptr__->value[0].field_0.field_0.z = -local_78;
  __return_storage_ptr__->value[1].field_0.field_0.z = -fStack_74;
  __return_storage_ptr__->value[2].field_0.field_0.z = -fVar10;
  __return_storage_ptr__->value[3].field_0.field_0.x =
       -(fVar3 * fVar2 + fVar11 * fVar4 + fVar9 * fVar6);
  __return_storage_ptr__->value[3].field_0.field_0.y =
       -(fVar8 * fVar2 + fVar5 * fVar4 + fVar7 * fVar6);
  __return_storage_ptr__->value[3].field_0.field_0.z =
       fVar2 * fVar10 + fVar4 * fStack_74 + fVar6 * local_78;
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::
view_matrix () const
{
	return glm::lookAt (from(), to(), up());
}